

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

ON_Mesh * __thiscall ON_Mesh::DuplicateFace(ON_Mesh *this,int face_index,ON_Mesh *mesh)

{
  int iVar1;
  uint mesh_vertex_count;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  ON_MeshFace *pOVar6;
  ON_3dPoint *V;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int vertex_count;
  long lVar12;
  ON_3dPoint *V_00;
  ulong newcap;
  int vi;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  ON_SimpleArray<ON_3dPoint> *local_80;
  ON_MeshFace f;
  
  if (mesh != this) {
    if (mesh != (ON_Mesh *)0x0) {
      Destroy(mesh);
    }
    iVar1 = (this->m_F).m_count;
    if (iVar1 <= face_index || face_index < 0) {
      return (ON_Mesh *)0x0;
    }
    mesh_vertex_count = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
    if (mesh_vertex_count < 3) {
      return (ON_Mesh *)0x0;
    }
    V = (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a;
    bVar14 = V != (ON_3dPoint *)0x0;
    V_00 = (ON_3dPoint *)0x0;
    bVar15 = mesh_vertex_count != (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count;
    if (bVar15) {
      V = V_00;
    }
    bVar11 = 0 < (int)mesh_vertex_count;
    bVar7 = (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count == mesh_vertex_count && bVar11;
    bVar8 = (this->m_C).m_count == mesh_vertex_count && bVar11;
    bVar9 = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count == mesh_vertex_count && bVar11;
    bVar10 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count == mesh_vertex_count && bVar11;
    bVar11 = (this->m_K).m_count == mesh_vertex_count && bVar11;
    if (bVar15 || !bVar14) {
      V_00 = (ON_3dPoint *)(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
    }
    iVar2 = (this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count;
    pOVar6 = (this->m_F).m_a + (uint)face_index;
    f.vi._0_8_ = *(undefined8 *)pOVar6->vi;
    f.vi._8_8_ = *(undefined8 *)(pOVar6->vi + 2);
    if (!bVar15 && bVar14) {
      bVar5 = ON_MeshFace::IsValid(&f,mesh_vertex_count,V);
      if (bVar5) goto LAB_00523eba;
      bVar5 = ON_MeshFace::Repair(&f,mesh_vertex_count,V);
    }
    else {
      if (V_00 == (ON_3dPoint *)0x0) {
        return (ON_Mesh *)0x0;
      }
      bVar5 = ON_MeshFace::IsValid(&f,mesh_vertex_count,(ON_3fPoint *)V_00);
      if (bVar5) goto LAB_00523eba;
      bVar5 = ON_MeshFace::Repair(&f,mesh_vertex_count,(ON_3fPoint *)V_00);
    }
    if (bVar5 != false) {
LAB_00523eba:
      iVar3 = f.vi[2];
      iVar4 = f.vi[3];
      bVar5 = f.vi[2] != f.vi[3];
      if (mesh == (ON_Mesh *)0x0) {
        mesh = (ON_Mesh *)operator_new(0x6e0);
        ON_Mesh(mesh);
      }
      newcap = (ulong)(bVar5 + 3);
      if (!bVar15 && bVar14) {
        local_80 = &(mesh->m_dV).super_ON_SimpleArray<ON_3dPoint>;
        ON_SimpleArray<ON_3dPoint>::Reserve(local_80,newcap);
      }
      else {
        local_80 = (ON_SimpleArray<ON_3dPoint> *)0x0;
      }
      ON_SimpleArray<ON_3fPoint>::Reserve(&(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>,newcap);
      ON_SimpleArray<ON_MeshFace>::Reserve(&mesh->m_F,1);
      pOVar6 = ON_SimpleArray<ON_MeshFace>::AppendNew(&mesh->m_F);
      pOVar6->vi[0] = 0;
      pOVar6->vi[1] = 1;
      pOVar6->vi[2] = 2;
      pOVar6->vi[3] = iVar3 == iVar4 ^ 3;
      if (iVar2 == iVar1) {
        ON_SimpleArray<ON_3fVector>::Reserve(&(mesh->m_FN).super_ON_SimpleArray<ON_3fVector>,1);
        ON_SimpleArray<ON_3fVector>::Append
                  (&(mesh->m_FN).super_ON_SimpleArray<ON_3fVector>,
                   (this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_a + (uint)face_index);
      }
      if (bVar7) {
        ON_SimpleArray<ON_3fVector>::Reserve(&(mesh->m_N).super_ON_SimpleArray<ON_3fVector>,newcap);
      }
      if (bVar9) {
        ON_SimpleArray<ON_2fPoint>::Reserve(&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,newcap);
      }
      if (bVar8) {
        ON_SimpleArray<ON_Color>::Reserve(&mesh->m_C,newcap);
      }
      if (bVar10) {
        ON_SimpleArray<ON_2dPoint>::Reserve(&(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>,newcap);
      }
      if (bVar11) {
        ON_SimpleArray<ON_SurfaceCurvature>::Reserve(&mesh->m_K,newcap);
      }
      for (uVar13 = 0; newcap != uVar13; uVar13 = uVar13 + 1) {
        lVar12 = (long)f.vi[uVar13];
        if (!bVar15 && bVar14) {
          ON_SimpleArray<ON_3dPoint>::Append(local_80,V + lVar12);
        }
        else {
          ON_SimpleArray<ON_3fPoint>::Append
                    (&(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>,
                     (ON_3fPoint *)((long)&V_00->x + lVar12 * 0xc));
        }
        if (bVar7) {
          ON_SimpleArray<ON_3fVector>::Append
                    (&(mesh->m_N).super_ON_SimpleArray<ON_3fVector>,
                     (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a + lVar12);
        }
        if (bVar9) {
          ON_SimpleArray<ON_2fPoint>::Append
                    (&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,
                     (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a + lVar12);
        }
        if (bVar8) {
          ON_SimpleArray<ON_Color>::Append(&mesh->m_C,(this->m_C).m_a + lVar12);
        }
        if (bVar10) {
          ON_SimpleArray<ON_2dPoint>::Append
                    (&(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>,
                     (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a + lVar12);
        }
        if (bVar11) {
          ON_SimpleArray<ON_SurfaceCurvature>::Append(&mesh->m_K,(this->m_K).m_a + lVar12);
        }
      }
      if (!bVar15 && bVar14) {
        UpdateSinglePrecisionVertices(mesh);
        return mesh;
      }
      return mesh;
    }
  }
  return (ON_Mesh *)0x0;
}

Assistant:

ON_Mesh* ON_Mesh::DuplicateFace( int face_index, ON_Mesh* mesh ) const
{
  if ( mesh == this )
    return nullptr;
  if ( 0 != mesh )
    mesh->Destroy();
  if ( face_index < 0 || face_index >= m_F.Count() )
    return nullptr;
  const unsigned int vcnt = VertexUnsignedCount();
  if ( vcnt < 3 )
    return nullptr;

  const ON_3dPoint* dV = ( vcnt == m_dV.UnsignedCount() ) ? m_dV.Array() : nullptr;
  const ON_3fPoint* fV = (nullptr == dV && vcnt == m_V.UnsignedCount() ) ? m_V.Array() : nullptr;
  bool bHasFaceNormals = HasFaceNormals();
  bool bHasVertexNormals = HasVertexNormals();
  bool bHasVertexColors = HasVertexColors();
  bool bHasTextureCoordinates = HasTextureCoordinates();
  bool bHasSurfaceParameters = HasSurfaceParameters();
  bool bHasPrincipalCurvatures = HasPrincipalCurvatures();

  ON_MeshFace f = m_F[face_index];
  if ( nullptr != dV )
  {
    if ( !f.IsValid(vcnt,dV) )
    {
      // invalid vertex indices - see if it can be fixed
      if ( !f.Repair(vcnt,dV) )
        return nullptr;
    }
  }
  else if (nullptr != fV)
  {
    if (!f.IsValid(vcnt, fV))
    {
      // invalid vertex indices - see if it can be fixed
      if (!f.Repair(vcnt, fV))
        return nullptr;
    }
  }
  else
    return nullptr;

  const int newvcnt = f.IsTriangle() ? 3 : 4;
  if ( 0 == mesh )
    mesh = new ON_Mesh();
  ON_3dPointArray* newdV = 0;
  if ( dV )
  {
    newdV = &mesh->m_dV;
    newdV->Reserve(newvcnt);
  }
  mesh->m_V.Reserve(newvcnt);
  mesh->m_F.Reserve(1);
  ON_MeshFace& newface = mesh->m_F.AppendNew();
  newface.vi[0] = 0;
  newface.vi[1] = 1;
  newface.vi[2] = 2;
  newface.vi[3] = (4 == newvcnt) ? 3 : newface.vi[2];

  if ( bHasFaceNormals )
  {
    mesh->m_FN.Reserve(1);
    mesh->m_FN.Append(m_FN[face_index]);
  }

  if ( bHasVertexNormals )
    mesh->m_N.Reserve(newvcnt);
  if ( bHasTextureCoordinates )
    mesh->m_T.Reserve(newvcnt);
  if ( bHasVertexColors )
    mesh->m_C.Reserve(newvcnt);
  if ( bHasSurfaceParameters )
    mesh->m_S.Reserve(newvcnt);
  if ( bHasPrincipalCurvatures )
    mesh->m_K.Reserve(newvcnt);
  for ( int vi = 0; vi < newvcnt; vi++ )
  {
    if ( dV )
      newdV->Append(dV[f.vi[vi]]);
    else
      mesh->m_V.Append(fV[f.vi[vi]]);
    if ( bHasVertexNormals )
      mesh->m_N.Append(m_N[f.vi[vi]]);
    if ( bHasTextureCoordinates )
      mesh->m_T.Append(m_T[f.vi[vi]]);
    if ( bHasVertexColors )
      mesh->m_C.Append(m_C[f.vi[vi]]);
    if ( bHasSurfaceParameters )
      mesh->m_S.Append(m_S[f.vi[vi]]);
    if ( bHasPrincipalCurvatures )
      mesh->m_K.Append(m_K[f.vi[vi]]);
  }
  if ( nullptr != dV )
    mesh->UpdateSinglePrecisionVertices();

  return mesh;
}